

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

FT_Pos psh_dimension_quantize_len(PSH_Dimension dim,FT_Pos len,FT_Bool do_snapping)

{
  ulong uVar1;
  long local_28;
  FT_Pos delta;
  ulong uStack_18;
  FT_Bool do_snapping_local;
  FT_Pos len_local;
  PSH_Dimension dim_local;
  
  if (len < 0x41) {
    uStack_18 = 0x40;
  }
  else {
    local_28 = len - (dim->stdw).widths[0].cur;
    if (local_28 < 0) {
      local_28 = -local_28;
    }
    uStack_18 = len;
    if ((local_28 < 0x28) && (uStack_18 = (dim->stdw).widths[0].cur, (long)uStack_18 < 0x30)) {
      uStack_18 = 0x30;
    }
    if ((long)uStack_18 < 0xc0) {
      uVar1 = uStack_18 & 0x3f;
      uStack_18 = uStack_18 & 0xffffffffffffffc0;
      if (uVar1 < 10) {
        uStack_18 = uVar1 + uStack_18;
      }
      else if (uVar1 < 0x20) {
        uStack_18 = uStack_18 + 10;
      }
      else if (uVar1 < 0x36) {
        uStack_18 = uStack_18 + 0x36;
      }
      else {
        uStack_18 = uVar1 + uStack_18;
      }
    }
    else {
      uStack_18 = uStack_18 + 0x20 & 0xffffffffffffffc0;
    }
  }
  if (do_snapping != '\0') {
    uStack_18 = uStack_18 + 0x20 & 0xffffffffffffffc0;
  }
  return uStack_18;
}

Assistant:

static FT_Pos
  psh_dimension_quantize_len( PSH_Dimension  dim,
                              FT_Pos         len,
                              FT_Bool        do_snapping )
  {
    if ( len <= 64 )
      len = 64;
    else
    {
      FT_Pos  delta = len - dim->stdw.widths[0].cur;


      if ( delta < 0 )
        delta = -delta;

      if ( delta < 40 )
      {
        len = dim->stdw.widths[0].cur;
        if ( len < 48 )
          len = 48;
      }

      if ( len < 3 * 64 )
      {
        delta = ( len & 63 );
        len  &= -64;

        if ( delta < 10 )
          len += delta;

        else if ( delta < 32 )
          len += 10;

        else if ( delta < 54 )
          len += 54;

        else
          len += delta;
      }
      else
        len = FT_PIX_ROUND( len );
    }

    if ( do_snapping )
      len = FT_PIX_ROUND( len );

    return  len;
  }